

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,string *item)

{
  _func_int **pp_Var1;
  char *pcVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string fw;
  string full_fw;
  cmOutputConverter converter;
  string fw_path;
  string local_218;
  string local_1f8;
  string local_1d8;
  cmOutputConverter local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  bVar3 = cmsys::RegularExpression::find
                    (&this->SplitFramework,(item->_M_dataplus)._M_p,&(this->SplitFramework).regmatch
                    );
  if (bVar3) {
    pcVar2 = (this->SplitFramework).regmatch.startp[1];
    pp_Var1 = (_func_int **)(local_198 + 0x10);
    local_198._0_8_ = pp_Var1;
    if (pcVar2 == (char *)0x0) {
      local_198._8_8_ = 0;
      local_188[0]._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,pcVar2,(this->SplitFramework).regmatch.endp[1]);
    }
    pcVar2 = (this->SplitFramework).regmatch.startp[2];
    if (pcVar2 == (char *)0x0) {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,pcVar2,(this->SplitFramework).regmatch.endp[2]);
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_198._0_8_,(pointer)(local_198._0_8_ + local_198._8_8_));
    std::__cxx11::string::append((char *)&local_1f8);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_1f8);
    std::__cxx11::string::append((char *)&local_1f8);
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->FrameworkPathsEmmitted,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->FrameworkPaths,(value_type *)local_198);
    }
    AddLibraryRuntimeInfo(this,&local_1f8);
    local_1b8.StateSnapshot.State._0_1_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<char_const(&)[11],bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(char (*) [11])"-framework",(bool *)&local_1b8);
    cmMakefile::GetStateSnapshot(this->Makefile);
    cmOutputConverter::cmOutputConverter(&local_1b8,(cmStateSnapshot *)&local_1d8);
    cmOutputConverter::EscapeForShell(&local_1d8,&local_1b8,&local_218,false,false,false);
    std::__cxx11::string::operator=((string *)&local_218,(string *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
        &local_1d8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_),
                      local_1d8.field_2._M_allocated_capacity + 1);
    }
    local_1d8._M_dataplus._M_p._0_1_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string&,bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_218,(bool *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
    if ((_func_int **)local_198._0_8_ != pp_Var1) {
      operator_delete((void *)local_198._0_8_,
                      CONCAT71(local_188[0]._M_allocated_capacity._1_7_,local_188[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Could not parse framework path \"",0x20);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(item->_M_dataplus)._M_p,item->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"linked by target ",0x11);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(std::string const& item)
{
  // Try to separate the framework name and path.
  if (!this->SplitFramework.find(item)) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str());
    return;
  }

  std::string fw_path = this->SplitFramework.match(1);
  std::string fw = this->SplitFramework.match(2);
  std::string full_fw = fw_path;
  full_fw += "/";
  full_fw += fw;
  full_fw += ".framework";
  full_fw += "/";
  full_fw += fw;

  // Add the directory portion to the framework search path.
  this->AddFrameworkPath(fw_path);

  // add runtime information
  this->AddLibraryRuntimeInfo(full_fw);

  // Add the item using the -framework option.
  this->Items.emplace_back("-framework", false);
  cmOutputConverter converter(this->Makefile->GetStateSnapshot());
  fw = converter.EscapeForShell(fw);
  this->Items.emplace_back(fw, false);
}